

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

ostream * glu::TextureTestUtil::operator<<(ostream *str,LogGradientFmt *fmt)

{
  ostream *poVar1;
  float fVar2;
  LogGradientFmt *fmt_local;
  ostream *str_local;
  
  poVar1 = std::operator<<(str,"(R: ");
  fVar2 = tcu::Vector<float,_4>::x(fmt->valueMin);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1," -> ");
  fVar2 = tcu::Vector<float,_4>::x(fmt->valueMax);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"G: ");
  fVar2 = tcu::Vector<float,_4>::y(fmt->valueMin);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1," -> ");
  fVar2 = tcu::Vector<float,_4>::y(fmt->valueMax);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"B: ");
  fVar2 = tcu::Vector<float,_4>::z(fmt->valueMin);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1," -> ");
  fVar2 = tcu::Vector<float,_4>::z(fmt->valueMax);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"A: ");
  fVar2 = tcu::Vector<float,_4>::w(fmt->valueMin);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1," -> ");
  fVar2 = tcu::Vector<float,_4>::w(fmt->valueMax);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,")");
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const LogGradientFmt& fmt)
{
	return str << "(R: " << fmt.valueMin->x() << " -> " << fmt.valueMax->x() << ", "
			   <<  "G: " << fmt.valueMin->y() << " -> " << fmt.valueMax->y() << ", "
			   <<  "B: " << fmt.valueMin->z() << " -> " << fmt.valueMax->z() << ", "
			   <<  "A: " << fmt.valueMin->w() << " -> " << fmt.valueMax->w() << ")";
}